

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite.cpp
# Opt level: O3

bool __thiscall
wallet::BindBlobToStatement
          (wallet *this,sqlite3_stmt *stmt,int index,Span<const_std::byte> blob,string *description)

{
  int iVar1;
  undefined4 in_register_00000014;
  char *pcVar2;
  long in_FS_OFFSET;
  string_view source_file;
  string_view logging_function;
  char *local_28;
  long local_20;
  
  pcVar2 = (char *)CONCAT44(in_register_00000014,index);
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (pcVar2 == (char *)0x0) {
    pcVar2 = "";
  }
  iVar1 = sqlite3_bind_blob(this,stmt,pcVar2,blob.m_data,0);
  if (iVar1 != 0) {
    local_28 = (char *)sqlite3_errstr(iVar1);
    source_file._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/sqlite.cpp"
    ;
    source_file._M_len = 0x61;
    logging_function._M_str = "BindBlobToStatement";
    logging_function._M_len = 0x13;
    LogPrintFormatInternal<std::__cxx11::string,char_const*>
              (logging_function,source_file,0x48,ALL,Info,(ConstevalFormatString<2U>)0x10ecb2c,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)blob.m_size,
               &local_28);
    sqlite3_clear_bindings(this);
    sqlite3_reset(this);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return iVar1 == 0;
  }
  __stack_chk_fail();
}

Assistant:

static bool BindBlobToStatement(sqlite3_stmt* stmt,
                                int index,
                                Span<const std::byte> blob,
                                const std::string& description)
{
    // Pass a pointer to the empty string "" below instead of passing the
    // blob.data() pointer if the blob.data() pointer is null. Passing a null
    // data pointer to bind_blob would cause sqlite to bind the SQL NULL value
    // instead of the empty blob value X'', which would mess up SQL comparisons.
    int res = sqlite3_bind_blob(stmt, index, blob.data() ? static_cast<const void*>(blob.data()) : "", blob.size(), SQLITE_STATIC);
    if (res != SQLITE_OK) {
        LogPrintf("Unable to bind %s to statement: %s\n", description, sqlite3_errstr(res));
        sqlite3_clear_bindings(stmt);
        sqlite3_reset(stmt);
        return false;
    }

    return true;
}